

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3VtabUnlockList(sqlite3 *db)

{
  VTable *pVVar1;
  VTable *pNext;
  VTable *p;
  sqlite3 *db_local;
  
  pNext = db->pDisconnect;
  if (pNext != (VTable *)0x0) {
    db->pDisconnect = (VTable *)0x0;
    sqlite3ExpirePreparedStatements(db,0);
    do {
      pVVar1 = pNext->pNext;
      sqlite3VtabUnlock(pNext);
      pNext = pVVar1;
    } while (pVVar1 != (VTable *)0x0);
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3VtabUnlockList(sqlite3 *db){
  VTable *p = db->pDisconnect;

  assert( sqlite3BtreeHoldsAllMutexes(db) );
  assert( sqlite3_mutex_held(db->mutex) );

  if( p ){
    db->pDisconnect = 0;
    sqlite3ExpirePreparedStatements(db, 0);
    do {
      VTable *pNext = p->pNext;
      sqlite3VtabUnlock(p);
      p = pNext;
    }while( p );
  }
}